

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::EntryAt(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  Var *values;
  undefined4 *puVar6;
  Var aValue;
  JavascriptLibrary *pJVar7;
  double T1;
  CallInfo local_b0;
  Var value;
  long local_a0;
  int64_t k;
  int64_t relativeIndex;
  JavascriptString *pJStack_88;
  charcount_t len;
  JavascriptString *pThis;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x2c4,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  jsReentLock._24_8_ = RecyclableObject::GetScriptContext(function);
  pTVar5 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)local_70,pTVar5);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x2c8,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pJStack_88 = (JavascriptString *)0x0;
  JsReentLock::unlock((JsReentLock *)local_70);
  GetThisStringArgument
            ((ArgumentReader *)&scriptContext,(ScriptContext *)jsReentLock._24_8_,
             L"String.prototype.at",&stack0xffffffffffffff78);
  JsReentLock::MutateArrayObject((JsReentLock *)local_70);
  JsReentLock::relock((JsReentLock *)local_70);
  relativeIndex._4_4_ = GetLength(pJStack_88);
  k = 0;
  if (((uint)scriptContext & 0xffffff) != 1 && ((ulong)scriptContext & 0xffffff) != 0) {
    JsReentLock::unlock((JsReentLock *)local_70);
    aValue = Arguments::operator[]((Arguments *)&scriptContext,1);
    T1 = JavascriptConversion::ToInteger(aValue,(ScriptContext *)jsReentLock._24_8_);
    k = NumberUtilities::TryToInt64(T1);
    JsReentLock::MutateArrayObject((JsReentLock *)local_70);
    JsReentLock::relock((JsReentLock *)local_70);
  }
  local_a0 = k;
  if (k < 0) {
    local_a0 = (ulong)relativeIndex._4_4_ + k;
  }
  if ((local_a0 < 0) || ((long)(ulong)relativeIndex._4_4_ <= local_a0)) {
    pJVar7 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
    callInfo_local =
         (CallInfo)JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
  }
  else {
    BVar3 = GetItemAt(pJStack_88,(charcount_t)local_a0,(Var *)&local_b0);
    if (BVar3 == 0) {
      pJVar7 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
      callInfo_local =
           (CallInfo)JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
    }
    else {
      local_b0 = (CallInfo)BreakSpeculation(local_b0);
      callInfo_local = local_b0;
    }
  }
  value._4_4_ = 1;
  JsReentLock::~JsReentLock((JsReentLock *)local_70);
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptString::EntryAt(RecyclableObject* function, CallInfo callInfo, ...) {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        JavascriptString * pThis = nullptr;

        // 1. Let O be ? RequireObjectCoercible(this value).
        // 2. Let S be ? ToString(O).
        JS_REENTRANT(jsReentLock, GetThisStringArgument(args, scriptContext, _u("String.prototype.at"), &pThis));

        // 3. Let len be the length of S.
        charcount_t len = pThis->GetLength();

        // 4. Let relativeIndex be ? ToInteger(index).
        int64_t relativeIndex = 0;

        if (args.Info.Count > 1)
        {
            JS_REENTRANT(jsReentLock, relativeIndex = NumberUtilities::TryToInt64(JavascriptConversion::ToInteger(args[1], scriptContext)));
        }

        // 5. If relativeIndex >= 0, then
        //     a. Let k be relativeIndex.
        // 6. Else,
        //     a. Let k be len + relativeIndex.
        int64_t k = relativeIndex;
        
        if (relativeIndex < 0)
        {
            k += len;
        }
        
        // 7. If k < 0 or k >= len, then return undefined.
        if (k < 0 || k >= (int64_t)len)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        
        Var value;
        // 8. Return the String value consisting of only the code unit at position k in S.
        if (pThis->GetItemAt((charcount_t)k, &value))
        {
#ifdef ENABLE_SPECTRE_RUNTIME_MITIGATIONS
            value = BreakSpeculation(value);
#endif
            return value;
        }
        else
        {
            // Yes, i except this to be
            return scriptContext->GetLibrary()->GetUndefined();
        }
    }